

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

optional<supermap::KeyValue<char,_char>_> __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void,_char>::find
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void,_char> *this,
          char *pattern,function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *less,
          function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *equal)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  KeyValue<char,_char> *in_RCX;
  optional<supermap::KeyValue<char,_char>_> *in_RDX;
  function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *in_RDI;
  KeyValue<char,_char> firstLeqElem;
  KeyValue<char,_char> middleElem;
  int middle;
  int lastGt;
  int firstLeq;
  undefined4 in_stack_ffffffffffffff98;
  _Storage<supermap::KeyValue<char,_char>,_true> local_44;
  bool local_42;
  int local_34;
  int local_30;
  _Storage<supermap::KeyValue<char,_char>,_true> local_3;
  bool local_1;
  
  iVar2 = (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 8))();
  if (iVar2 == 0) {
    std::optional<supermap::KeyValue<char,_char>_>::optional
              ((optional<supermap::KeyValue<char,_char>_> *)&local_3);
  }
  else {
    local_30 = 0;
    local_34 = (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 8))();
    iVar2 = local_30;
    while (local_30 = iVar2, 1 < local_34 - local_30) {
      iVar2 = (local_30 + local_34) / 2;
      (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 0x20))
                (in_RDI,iVar2,(long)(local_30 + local_34) % 2 & 0xffffffff);
      bVar1 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::operator()
                        (in_RDI,in_RCX,(char *)in_RDX);
      if ((!bVar1) &&
         (bVar1 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::
                  operator()(in_RDI,in_RCX,(char *)in_RDX), !bVar1)) {
        local_34 = iVar2;
        iVar2 = local_30;
      }
    }
    iVar2 = local_30;
    iVar3 = (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 8))();
    if (iVar2 < iVar3) {
      (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 0x20))(in_RDI,local_30);
      bVar1 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::operator()
                        (in_RDI,in_RCX,(char *)in_RDX);
      if (bVar1) {
        std::optional<supermap::KeyValue<char,_char>_>::
        optional<supermap::KeyValue<char,_char>_&,_true>
                  (in_RDX,(KeyValue<char,_char> *)CONCAT44(iVar2,in_stack_ffffffffffffff98));
      }
      else {
        std::optional<supermap::KeyValue<char,_char>_>::optional
                  ((optional<supermap::KeyValue<char,_char>_> *)&local_3);
      }
    }
    else {
      std::optional<supermap::KeyValue<char,_char>_>::optional
                ((optional<supermap::KeyValue<char,_char>_> *)&local_3);
    }
  }
  local_42 = local_1;
  local_44 = local_3;
  return (_Optional_base<supermap::KeyValue<char,_char>,_true,_true>)
         (_Optional_base<supermap::KeyValue<char,_char>,_true,_true>)_local_44;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }